

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_8x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  
  h_predictor_8x16xc(in_RDI,in_RSI,in_RDX,in_RCX,2);
  return;
}

Assistant:

void aom_h_predictor_8x32_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  h_predictor_8x16xc(dst, stride, above, left, 2);
}